

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

void __thiscall
QTabWidgetPrivate::initBasicStyleOption(QTabWidgetPrivate *this,QStyleOptionTabWidgetFrame *option)

{
  QWidget *widget;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  Shape SVar6;
  QStyle *pQVar7;
  
  widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QStyleOption::initFrom(&option->super_QStyleOption,widget);
  bVar4 = QTabWidget::documentMode((QTabWidget *)widget);
  iVar5 = 0;
  if (!bVar4) {
    pQVar7 = QWidget::style(widget);
    iVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,5,0,widget);
  }
  option->lineWidth = iVar5;
  switch(this->pos) {
  case North:
    SVar6 = (uint)(this->shape != Rounded) << 2;
    break;
  case South:
    SVar6 = (uint)(this->shape != Rounded) * 4 + RoundedSouth;
    break;
  case West:
    SVar6 = (uint)(this->shape != Rounded) * 4 + RoundedWest;
    break;
  case East:
    SVar6 = (uint)(this->shape != Rounded) * 4 + RoundedEast;
    break;
  default:
    goto switchD_0046949d_default;
  }
  option->shape = SVar6;
switchD_0046949d_default:
  lVar1 = *(long *)(*(long *)(*(long *)&widget->field_0x8 + 600) + 0x20);
  uVar2 = *(undefined8 *)(lVar1 + 0x14);
  uVar3 = *(undefined8 *)(lVar1 + 0x1c);
  (option->tabBarRect).x1 = (Representation)(int)uVar2;
  (option->tabBarRect).y1 = (Representation)(int)((ulong)uVar2 >> 0x20);
  (option->tabBarRect).x2 = (Representation)(int)uVar3;
  (option->tabBarRect).y2 = (Representation)(int)((ulong)uVar3 >> 0x20);
  return;
}

Assistant:

void QTabWidgetPrivate::initBasicStyleOption(QStyleOptionTabWidgetFrame *option) const
{
    Q_Q(const QTabWidget);
    option->initFrom(q);

    if (q->documentMode())
        option->lineWidth = 0;
    else
        option->lineWidth = q->style()->pixelMetric(QStyle::PM_DefaultFrameWidth, nullptr, q);

    switch (pos) {
    case QTabWidget::North:
        option->shape = shape == QTabWidget::Rounded ? QTabBar::RoundedNorth
                                                     : QTabBar::TriangularNorth;
        break;
    case QTabWidget::South:
        option->shape = shape == QTabWidget::Rounded ? QTabBar::RoundedSouth
                                                     : QTabBar::TriangularSouth;
        break;
    case QTabWidget::West:
        option->shape = shape == QTabWidget::Rounded ? QTabBar::RoundedWest
                                                     : QTabBar::TriangularWest;
        break;
    case QTabWidget::East:
        option->shape = shape == QTabWidget::Rounded ? QTabBar::RoundedEast
                                                     : QTabBar::TriangularEast;
        break;
    }

    option->tabBarRect = q->tabBar()->geometry();
}